

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::rowsRemoved
          (QAbstractItemViewPrivate *this,QModelIndex *index,int start,int end)

{
  long *plVar1;
  char cVar2;
  long in_FS_OFFSET;
  code *local_60;
  undefined8 local_58;
  long *local_50;
  undefined8 local_48;
  int local_40;
  undefined4 uStack_3c;
  int iStack_38;
  undefined4 uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  if ((*(byte *)(plVar1[4] + 9) & 0x80) != 0) {
    (**(code **)(*plVar1 + 0x260))(plVar1);
  }
  *(undefined4 *)(plVar1[1] + 0x3a8) = 0;
  cVar2 = QAccessible::isActive();
  if (cVar2 != '\0') {
    local_48 = 0x4ffffffff;
    local_60 = QIcon::QIcon;
    uStack_3c = 0xffffffff;
    uStack_34 = 0xffffffff;
    local_58 = 0xaaaaaaaa00000116;
    local_50 = plVar1;
    local_40 = start;
    iStack_38 = end;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_60);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)&local_60);
  }
  updateGeometry(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::rowsRemoved(const QModelIndex &index, int start, int end)
{
    Q_UNUSED(index);
    Q_UNUSED(start);
    Q_UNUSED(end);

    Q_Q(QAbstractItemView);
    if (q->isVisible())
        q->updateEditorGeometries();
    q->setState(QAbstractItemView::NoState);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(q, QAccessibleTableModelChangeEvent::RowsRemoved);
        accessibleEvent.setFirstRow(start);
        accessibleEvent.setLastRow(end);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    updateGeometry();
}